

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O0

int pkey_rsa_sign(EVP_PKEY_CTX *ctx,uint8_t *sig,size_t *siglen,uint8_t *tbs,size_t tbslen)

{
  int iVar1;
  uint local_54;
  ulong uStack_50;
  uint out_len;
  size_t key_len;
  RSA *rsa;
  RSA_PKEY_CTX *rctx;
  size_t tbslen_local;
  uint8_t *tbs_local;
  size_t *siglen_local;
  uint8_t *sig_local;
  EVP_PKEY_CTX *ctx_local;
  
  rsa = (RSA *)ctx->data;
  key_len = (size_t)ctx->pkey->pkey;
  rctx = (RSA_PKEY_CTX *)tbslen;
  tbslen_local = (size_t)tbs;
  tbs_local = (uint8_t *)siglen;
  siglen_local = (size_t *)sig;
  sig_local = (uint8_t *)ctx;
  iVar1 = EVP_PKEY_size((EVP_PKEY *)ctx->pkey);
  uStack_50 = (ulong)iVar1;
  if (siglen_local == (size_t *)0x0) {
    *(ulong *)tbs_local = uStack_50;
    ctx_local._4_4_ = 1;
  }
  else if (*(ulong *)tbs_local < uStack_50) {
    ERR_put_error(6,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                  ,0x8f);
    ctx_local._4_4_ = 0;
  }
  else if (rsa->d == (BIGNUM *)0x0) {
    ctx_local._4_4_ =
         RSA_sign_raw((RSA *)key_len,(size_t *)tbs_local,(uint8_t *)siglen_local,
                      *(size_t *)tbs_local,(uint8_t *)tbslen_local,(size_t)rctx,*(int *)&rsa->e);
  }
  else if (*(int *)&rsa->e == 1) {
    iVar1 = EVP_MD_type((EVP_MD *)rsa->d);
    iVar1 = RSA_sign(iVar1,(uchar *)tbslen_local,(uint)rctx,(uchar *)siglen_local,&local_54,
                     (RSA *)key_len);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      *(ulong *)tbs_local = (ulong)local_54;
      ctx_local._4_4_ = 1;
    }
  }
  else if (*(int *)&rsa->e == 6) {
    ctx_local._4_4_ =
         RSA_sign_pss_mgf1((RSA *)key_len,(size_t *)tbs_local,(uint8_t *)siglen_local,
                           *(size_t *)tbs_local,(uint8_t *)tbslen_local,(size_t)rctx,
                           (EVP_MD *)rsa->d,(EVP_MD *)rsa->p,*(int *)&rsa->q);
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_rsa_sign(EVP_PKEY_CTX *ctx, uint8_t *sig, size_t *siglen,
                         const uint8_t *tbs, size_t tbslen) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  RSA *rsa = reinterpret_cast<RSA *>(ctx->pkey->pkey);
  const size_t key_len = EVP_PKEY_size(ctx->pkey);

  if (!sig) {
    *siglen = key_len;
    return 1;
  }

  if (*siglen < key_len) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (rctx->md) {
    unsigned out_len;
    switch (rctx->pad_mode) {
      case RSA_PKCS1_PADDING:
        if (!RSA_sign(EVP_MD_type(rctx->md), tbs, tbslen, sig, &out_len, rsa)) {
          return 0;
        }
        *siglen = out_len;
        return 1;

      case RSA_PKCS1_PSS_PADDING:
        return RSA_sign_pss_mgf1(rsa, siglen, sig, *siglen, tbs, tbslen,
                                 rctx->md, rctx->mgf1md, rctx->saltlen);

      default:
        return 0;
    }
  }

  return RSA_sign_raw(rsa, siglen, sig, *siglen, tbs, tbslen, rctx->pad_mode);
}